

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O2

void ImGui_ImplOpenGL3_SetupRenderState
               (ImDrawData *draw_data,int fb_width,int fb_height,GLuint vertex_array_object)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float local_78 [6];
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  (*gl3wEnable)(0xbe2);
  (*gl3wBlendEquation)(0x8006);
  (*gl3wBlendFunc)(0x302,0x303);
  (*gl3wDisable)(0xb44);
  (*gl3wDisable)(0xb71);
  (*gl3wEnable)(0xc11);
  (*gl3wPolygonMode)(0x408,0x1b02);
  (*gl3wViewport)(0,0,fb_width,fb_height);
  local_78[1] = 0.0;
  local_78[2] = 0.0;
  local_78[3] = 0.0;
  local_78[4] = 0.0;
  local_60 = 0;
  uStack_58 = 0;
  local_50 = 0xbf800000;
  fVar1 = (draw_data->DisplayPos).x;
  fVar2 = (draw_data->DisplayPos).y;
  fVar3 = (draw_data->DisplaySize).x + fVar1;
  fVar4 = (draw_data->DisplaySize).y + fVar2;
  local_78[0] = 2.0 / (fVar3 - fVar1);
  local_78[5] = 2.0 / (fVar2 - fVar4);
  auVar5._0_4_ = fVar1 + fVar3;
  auVar5._4_4_ = fVar2 + fVar4;
  auVar5._8_8_ = 0;
  auVar6._4_4_ = fVar4 - fVar2;
  auVar6._0_4_ = fVar1 - fVar3;
  auVar6._8_8_ = 0;
  auVar6 = divps(auVar5,auVar6);
  local_48 = auVar6._0_8_;
  uStack_40 = 0x3f80000000000000;
  (*gl3wUseProgram)(g_ShaderHandle);
  (*gl3wUniform1i)(g_AttribLocationTex,0);
  (*gl3wUniformMatrix4fv)(g_AttribLocationProjMtx,1,'\0',local_78);
  (*gl3wBindSampler)(0,0);
  (*gl3wBindVertexArray)(vertex_array_object);
  (*gl3wBindBuffer)(0x8892,g_VboHandle);
  (*gl3wBindBuffer)(0x8893,g_ElementsHandle);
  (*gl3wEnableVertexAttribArray)(g_AttribLocationVtxPos);
  (*gl3wEnableVertexAttribArray)(g_AttribLocationVtxUV);
  (*gl3wEnableVertexAttribArray)(g_AttribLocationVtxColor);
  (*gl3wVertexAttribPointer)(g_AttribLocationVtxPos,2,0x1406,'\0',0x14,(GLvoid *)0x0);
  (*gl3wVertexAttribPointer)(g_AttribLocationVtxUV,2,0x1406,'\0',0x14,(GLvoid *)0x8);
  (*gl3wVertexAttribPointer)(g_AttribLocationVtxColor,4,0x1401,'\x01',0x14,(GLvoid *)0x10);
  return;
}

Assistant:

static void ImGui_ImplOpenGL3_SetupRenderState(ImDrawData* draw_data, int fb_width, int fb_height, GLuint vertex_array_object)
{
    // Setup render state: alpha-blending enabled, no face culling, no depth testing, scissor enabled, polygon fill
    glEnable(GL_BLEND);
    glBlendEquation(GL_FUNC_ADD);
    glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
    glDisable(GL_CULL_FACE);
    glDisable(GL_DEPTH_TEST);
    glEnable(GL_SCISSOR_TEST);
#ifdef GL_POLYGON_MODE
    glPolygonMode(GL_FRONT_AND_BACK, GL_FILL);
#endif

    // Support for GL 4.5 rarely used glClipControl(GL_UPPER_LEFT)
    bool clip_origin_lower_left = true;
#if defined(GL_CLIP_ORIGIN) && !defined(__APPLE__)
    GLenum current_clip_origin = 0; glGetIntegerv(GL_CLIP_ORIGIN, (GLint*)&current_clip_origin);
    if (current_clip_origin == GL_UPPER_LEFT)
        clip_origin_lower_left = false;
#endif

    // Setup viewport, orthographic projection matrix
    // Our visible imgui space lies from draw_data->DisplayPos (top left) to draw_data->DisplayPos+data_data->DisplaySize (bottom right). DisplayPos is (0,0) for single viewport apps.
    glViewport(0, 0, (GLsizei)fb_width, (GLsizei)fb_height);
    float L = draw_data->DisplayPos.x;
    float R = draw_data->DisplayPos.x + draw_data->DisplaySize.x;
    float T = draw_data->DisplayPos.y;
    float B = draw_data->DisplayPos.y + draw_data->DisplaySize.y;
    if (!clip_origin_lower_left) { float tmp = T; T = B; B = tmp; } // Swap top and bottom if origin is upper left
    const float ortho_projection[4][4] =
    {
        { 2.0f/(R-L),   0.0f,         0.0f,   0.0f },
        { 0.0f,         2.0f/(T-B),   0.0f,   0.0f },
        { 0.0f,         0.0f,        -1.0f,   0.0f },
        { (R+L)/(L-R),  (T+B)/(B-T),  0.0f,   1.0f },
    };
    glUseProgram(g_ShaderHandle);
    glUniform1i(g_AttribLocationTex, 0);
    glUniformMatrix4fv(g_AttribLocationProjMtx, 1, GL_FALSE, &ortho_projection[0][0]);
#ifdef GL_SAMPLER_BINDING
    glBindSampler(0, 0); // We use combined texture/sampler state. Applications using GL 3.3 may set that otherwise.
#endif

    (void)vertex_array_object;
#ifndef IMGUI_IMPL_OPENGL_ES2
    glBindVertexArray(vertex_array_object);
#endif

    // Bind vertex/index buffers and setup attributes for ImDrawVert
    glBindBuffer(GL_ARRAY_BUFFER, g_VboHandle);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, g_ElementsHandle);
    glEnableVertexAttribArray(g_AttribLocationVtxPos);
    glEnableVertexAttribArray(g_AttribLocationVtxUV);
    glEnableVertexAttribArray(g_AttribLocationVtxColor);
    glVertexAttribPointer(g_AttribLocationVtxPos,   2, GL_FLOAT,         GL_FALSE, sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, pos));
    glVertexAttribPointer(g_AttribLocationVtxUV,    2, GL_FLOAT,         GL_FALSE, sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, uv));
    glVertexAttribPointer(g_AttribLocationVtxColor, 4, GL_UNSIGNED_BYTE, GL_TRUE,  sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, col));
}